

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O2

short mixtype(obj *o1,obj *o2)

{
  byte bVar1;
  byte bVar2;
  char *__s1;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  obj *poVar8;
  uint uVar9;
  long lVar10;
  short *psVar11;
  
  poVar8 = o2;
  if ((o1->oclass == '\b') && (o2->otyp == 0x140)) {
    poVar8 = o1;
    o1 = o2;
  }
  sVar3 = o1->otyp;
  if ((sVar3 == 0x140) && ((poVar8->otyp & 0xfffeU) == 0x150)) {
    return poVar8->otyp;
  }
  if (o1->oclass == '\b') {
    if (alchemy_init_done == '\0') {
      psVar11 = &objects[0x12a].oc_descr_idx;
      for (lVar10 = 0; lVar10 != 0x26; lVar10 = lVar10 + 1) {
        __s1 = obj_descr[*psVar11].oc_descr;
        iVar4 = strcmp(__s1,"white");
        sVar3 = (short)lVar10;
        if (iVar4 == 0) {
          alchemy_table1[lVar10] = '\0';
          alchemy_table2[0] = sVar3 + 0x12a;
        }
        else {
          iVar4 = strcmp(__s1,"pink");
          if (iVar4 == 0) {
            alchemy_table1[lVar10] = '\x01';
            alchemy_table2[1] = sVar3 + 0x12a;
          }
          else {
            iVar4 = strcmp(__s1,"sky blue");
            if (iVar4 == 0) {
              alchemy_table1[lVar10] = '\x02';
              alchemy_table2[2] = sVar3 + 0x12a;
            }
            else {
              iVar4 = strcmp(__s1,"puce");
              if (iVar4 == 0) {
                alchemy_table1[lVar10] = '\x03';
                alchemy_table2[3] = sVar3 + 0x12a;
              }
              else {
                iVar4 = strcmp(__s1,"yellow");
                if (iVar4 == 0) {
                  alchemy_table1[lVar10] = '\x04';
                  alchemy_table2[4] = sVar3 + 0x12a;
                }
                else {
                  iVar4 = strcmp(__s1,"orange");
                  if (iVar4 == 0) {
                    alchemy_table1[lVar10] = '\x05';
                    alchemy_table2[5] = sVar3 + 0x12a;
                  }
                  else {
                    iVar4 = strcmp(__s1,"emerald");
                    if (iVar4 == 0) {
                      alchemy_table1[lVar10] = '\x06';
                      alchemy_table2[6] = sVar3 + 0x12a;
                    }
                    else {
                      iVar4 = strcmp(__s1,"ochre");
                      if (iVar4 == 0) {
                        alchemy_table1[lVar10] = '\a';
                        alchemy_table2[7] = sVar3 + 0x12a;
                      }
                      else {
                        iVar4 = strcmp(__s1,"black");
                        if (iVar4 == 0) {
                          alchemy_table1[lVar10] = '\b';
                          alchemy_table2[8] = sVar3 + 0x12a;
                        }
                        else {
                          iVar4 = strcmp(__s1,"ruby");
                          if (iVar4 == 0) {
                            alchemy_table1[lVar10] = '\t';
                            alchemy_table2[9] = sVar3 + 0x12a;
                          }
                          else {
                            iVar4 = strcmp(__s1,"indigo");
                            if (iVar4 == 0) {
                              alchemy_table1[lVar10] = '\n';
                              alchemy_table2[10] = sVar3 + 0x12a;
                            }
                            else {
                              iVar4 = strcmp(__s1,"magenta");
                              if (iVar4 == 0) {
                                alchemy_table1[lVar10] = '\v';
                                alchemy_table2[0xb] = sVar3 + 0x12a;
                              }
                              else {
                                iVar4 = strcmp(__s1,"golden");
                                if (iVar4 == 0) {
                                  alchemy_table1[lVar10] = '\f';
                                  alchemy_table2[0xc] = sVar3 + 0x12a;
                                }
                                else {
                                  iVar4 = strcmp(__s1,"amber");
                                  if (iVar4 == 0) {
                                    alchemy_table1[lVar10] = '\r';
                                    alchemy_table2[0xd] = sVar3 + 0x12a;
                                  }
                                  else {
                                    iVar4 = strcmp(__s1,"dark green");
                                    if (iVar4 == 0) {
                                      alchemy_table1[lVar10] = '\x0e';
                                      alchemy_table2[0xe] = sVar3 + 0x12a;
                                    }
                                    else {
                                      iVar4 = strcmp(__s1,"brown");
                                      if (iVar4 == 0) {
                                        alchemy_table1[lVar10] = '\x0f';
                                        alchemy_table2[0xf] = sVar3 + 0x12a;
                                      }
                                      else {
                                        iVar4 = strcmp(__s1,"silver");
                                        alchemy_table1[lVar10] = -1;
                                        if (iVar4 == 0) {
                                          alchemy_table2[0x10] = sVar3 + 0x12a;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        psVar11 = psVar11 + 0x14;
      }
      alchemy_init_done = '\x01';
      sVar3 = o1->otyp;
    }
    bVar1 = (&DAT_00355426)[sVar3];
    uVar6 = (uint)(char)bVar1;
    if ((char)bVar1 < '\0') {
      return 0;
    }
    bVar2 = (&DAT_00355426)[poVar8->otyp];
    if ((char)bVar2 < '\0') {
      return 0;
    }
    uVar9 = (uint)(char)bVar2;
    if ((bVar2 == 0) || ((uVar5 = uVar9, bVar1 != 0 && (bVar2 == 8)))) {
      uVar5 = uVar6;
      uVar6 = uVar9;
    }
    if ((uVar6 == 0) && (uVar5 == 8)) {
      return alchemy_table2[0x10];
    }
    uVar9 = uVar6 & 7;
    if (uVar9 < 7) {
      if ((0x16U >> uVar9 & 1) == 0) {
        if ((0x68U >> uVar9 & 1) != 0) {
LAB_00214303:
          if (((uVar5 & 7) < 7) && ((0x68U >> (uVar5 & 7) & 1) != 0)) goto LAB_0021432b;
        }
        goto LAB_00214379;
      }
      if ((4 < (uVar5 & 7)) || ((0x16U >> (uVar5 & 7) & 1) == 0)) {
        if (uVar9 == 3) goto LAB_00214303;
        goto LAB_00214379;
      }
LAB_0021432b:
      uVar9 = (uint)(char)(bVar2 | bVar1);
      if (((bVar2 ^ bVar1) & 8) != 0) {
        uVar7 = *(uint *)&o1->field_0x4a >> 8 & 3;
        if (uVar7 == (*(uint *)&poVar8->field_0x4a >> 8 & 3)) {
          uVar6 = mt_random();
          uVar6 = uVar6 << 3;
        }
        else if (uVar7 == 0) {
          uVar6 = uVar5;
        }
        uVar9 = uVar9 ^ uVar6 & 8;
      }
    }
    else {
LAB_00214379:
      if ((uVar5 & 8 ^ uVar6) != 8) goto LAB_002142d8;
      uVar9 = uVar5 ^ 8;
    }
    sVar3 = alchemy_table2[(int)uVar9];
    if (obj_descr[objects[sVar3].oc_name_idx].oc_name == (char *)0x0) {
      sVar3 = 0;
    }
  }
  else {
    if (sVar3 == 0x200) {
      if (poVar8->otyp == 0x13e) {
        return 0x140;
      }
    }
    else if ((sVar3 == 0x10a) && (uVar6 = (ushort)poVar8->otyp - 0x12d, uVar6 < 0x25)) {
      if ((0x18000000c1U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
        return 0x14f;
      }
      if ((ulong)uVar6 == 0x12) {
        return 0x140;
      }
    }
LAB_002142d8:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static short mixtype(struct obj *o1, struct obj *o2)
{
	/* cut down on the number of cases below */
	if (o1->oclass == POTION_CLASS && o2->otyp == POT_FRUIT_JUICE) {
		struct obj *swp;

		swp = o1; o1 = o2; o2 = swp;
	}

	switch (o1->otyp) {
	    case POT_FRUIT_JUICE:
		switch (o2->otyp) {
		    case POT_BLOOD:
			return POT_BLOOD;
		    case POT_VAMPIRE_BLOOD:
			return POT_VAMPIRE_BLOOD;
		}
		break;
	}

	if (o1->oclass == POTION_CLASS) {
	    int i1, i2, result;

	    alchemy_init();
	    i1 = alchemy_table1[o1->otyp - POT_GAIN_ABILITY];
	    i2 = alchemy_table1[o2->otyp - POT_GAIN_ABILITY];

	    /* check that both potions are of mixable types */
	    if (i1 < 0 || i2 < 0)
		return 0;

	    /* swap for simplified checks */
	    if (i2 == ALCHEMY_WHITE || (i2 == ALCHEMY_BLACK && i1 != ALCHEMY_WHITE)) {
		result = i1;
		i1 = i2;
		i2 = result;
	    }

	    if (i1 == ALCHEMY_WHITE && i2 == ALCHEMY_BLACK) {
		return ALCHEMY_GRAY;
	    } else if ((IS_PRIMARY_COLOR(i1) && IS_PRIMARY_COLOR(i2)) ||
		       (IS_SECONDARY_COLOR(i1) && IS_SECONDARY_COLOR(i2))) {
		/* bitwise OR simulates pigment addition */
		result = i1 | i2;
		/* adjust light/dark level if necessary */
		if ((i1 ^ i2) & 8) {
		    if (o1->odiluted == o2->odiluted) {
			/* same dilution level, randomly toggle */
			result ^= (rn2(2) << 3);
		    } else {
			/* use dark/light level of undiluted potion */
			result ^= (o1->odiluted ? i1 : i2) & 8;
		    }
		}
	    } else if ((i1 == ALCHEMY_WHITE && IS_DARK_COLOR(i2)) ||
		       (i1 == ALCHEMY_BLACK && IS_LIGHT_COLOR(i2))) {
		/* toggle light/dark bit */
		result = i2 ^ 8;
	    } else {
		return 0;
	    }

	    /* don't create non-existing potions */
	    if (OBJ_NAME(objects[alchemy_table2[result]]) == 0)
		return 0;

	    return alchemy_table2[result];
	} else {
	    switch (o1->otyp) {
		case UNICORN_HORN:
		    switch (o2->otyp) {
			case POT_SICKNESS:
			    return POT_FRUIT_JUICE;
			case POT_HALLUCINATION:
			case POT_BLINDNESS:
			case POT_CONFUSION:
			case POT_BLOOD:
			case POT_VAMPIRE_BLOOD:
			    return POT_WATER;
		    }
		    break;
		case AMETHYST:	/* "a-methyst" == "not intoxicated" */
		    if (o2->otyp == POT_BOOZE)
			return POT_FRUIT_JUICE;
		    break;
		}
	}

	return 0;
}